

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpTcpEventLoopThreadPool.cpp
# Opt level: O1

void __thiscall
sznet::net::KcpTcpEventLoopThreadPool::KcpTcpEventLoopThreadPool
          (KcpTcpEventLoopThreadPool *this,KcpTcpEventLoop *baseLoop,
          vector<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_> *udpListenAddrs,
          string *nameArg)

{
  pointer pcVar1;
  
  this->m_baseLoop = baseLoop;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  pcVar1 = (nameArg->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_name,pcVar1,pcVar1 + nameArg->_M_string_length);
  this->m_started = false;
  this->m_numThreads = 0;
  this->m_next = 0;
  (this->m_threads).
  super__Vector_base<std::unique_ptr<sznet::net::KcpTcpEventLoopThread,_std::default_delete<sznet::net::KcpTcpEventLoopThread>_>,_std::allocator<std::unique_ptr<sznet::net::KcpTcpEventLoopThread,_std::default_delete<sznet::net::KcpTcpEventLoopThread>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_threads).
  super__Vector_base<std::unique_ptr<sznet::net::KcpTcpEventLoopThread,_std::default_delete<sznet::net::KcpTcpEventLoopThread>_>,_std::allocator<std::unique_ptr<sznet::net::KcpTcpEventLoopThread,_std::default_delete<sznet::net::KcpTcpEventLoopThread>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_threads).
  super__Vector_base<std::unique_ptr<sznet::net::KcpTcpEventLoopThread,_std::default_delete<sznet::net::KcpTcpEventLoopThread>_>,_std::allocator<std::unique_ptr<sznet::net::KcpTcpEventLoopThread,_std::default_delete<sznet::net::KcpTcpEventLoopThread>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_loops).
  super__Vector_base<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_threads).
  super__Vector_base<std::unique_ptr<sznet::net::KcpTcpEventLoopThread,_std::default_delete<sznet::net::KcpTcpEventLoopThread>_>,_std::allocator<std::unique_ptr<sznet::net::KcpTcpEventLoopThread,_std::default_delete<sznet::net::KcpTcpEventLoopThread>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_loops).
  super__Vector_base<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_loops).
  super__Vector_base<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_loops).
  super__Vector_base<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_>::vector
            (&this->m_udpListenAddrs,udpListenAddrs);
  return;
}

Assistant:

KcpTcpEventLoopThreadPool::KcpTcpEventLoopThreadPool(KcpTcpEventLoop* baseLoop, const std::vector<InetAddress>& udpListenAddrs, const string& nameArg) :
	m_baseLoop(baseLoop),
	m_name(nameArg),
	m_started(false),
	m_numThreads(0),
	m_next(0),
	m_udpListenAddrs(udpListenAddrs)
{
}